

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O3

socket_handle __thiscall
FIX::SocketServer::add
          (SocketServer *this,int port,bool reuse,bool noDelay,int sendBufSize,int rcvBufSize)

{
  _Rb_tree_header *p_Var1;
  socket_handle s;
  _Base_ptr p_Var2;
  mapped_type *pmVar3;
  SocketException *this_00;
  _Base_ptr p_Var4;
  socket_handle socket;
  int local_40;
  socket_handle local_3c;
  PortToInfo *local_38;
  
  local_38 = &this->m_portToInfo;
  p_Var2 = (this->m_portToInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_40 = port;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var1 = &(this->m_portToInfo)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var1->_M_header;
    do {
      if (port <= (int)p_Var2[1]._M_color) {
        p_Var4 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < port];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var1) && ((int)p_Var4[1]._M_color <= port)) {
      pmVar3 = std::
               map<int,_FIX::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
               ::operator[](local_38,&local_40);
      return pmVar3->m_socket;
    }
  }
  s = socket_createAcceptor(port,reuse);
  local_3c = s;
  if (s != -1) {
    if (noDelay) {
      socket_setsockopt(s,1);
    }
    if (sendBufSize != 0) {
      socket_setsockopt(s,7,sendBufSize);
    }
    if (rcvBufSize != 0) {
      socket_setsockopt(s,8,rcvBufSize);
    }
    SocketMonitor::addRead(&this->m_monitor,s);
    pmVar3 = std::
             map<int,_FIX::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
             ::operator[](&this->m_socketToInfo,&local_3c);
    pmVar3->m_socket = s;
    pmVar3->m_port = (short)port;
    pmVar3->m_noDelay = noDelay;
    pmVar3->m_sendBufSize = sendBufSize;
    pmVar3->m_rcvBufSize = rcvBufSize;
    pmVar3 = std::
             map<int,_FIX::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
             ::operator[](local_38,&local_40);
    pmVar3->m_socket = s;
    pmVar3->m_port = (short)port;
    pmVar3->m_noDelay = noDelay;
    pmVar3->m_sendBufSize = sendBufSize;
    pmVar3->m_rcvBufSize = rcvBufSize;
    return local_3c;
  }
  this_00 = (SocketException *)__cxa_allocate_exception(0x50);
  SocketException::SocketException(this_00);
  __cxa_throw(this_00,&SocketException::typeinfo,FIX::Exception::~Exception);
}

Assistant:

socket_handle SocketServer::add( int port, bool reuse, bool noDelay,
                       int sendBufSize, int rcvBufSize )
  EXCEPT ( SocketException& )
{
  if( m_portToInfo.find(port) != m_portToInfo.end() )
    return m_portToInfo[port].m_socket;

  socket_handle socket = socket_createAcceptor( port, reuse );
  if( socket == INVALID_SOCKET_HANDLE)
    throw SocketException();
  if( noDelay )
    socket_setsockopt( socket, TCP_NODELAY );
  if( sendBufSize )
    socket_setsockopt( socket, SO_SNDBUF, sendBufSize );
  if( rcvBufSize )
    socket_setsockopt( socket, SO_RCVBUF, rcvBufSize );
  m_monitor.addRead( socket );

  SocketInfo info( socket, port, noDelay, sendBufSize, rcvBufSize );
  m_socketToInfo[socket] = info;
  m_portToInfo[port] = info;
  return socket;
}